

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void neon_store_reg(TCGContext_conflict1 *tcg_ctx,int reg,int pass,TCGv_i32 var)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = pass + reg * 2;
  uVar2 = uVar1 * 4;
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i32,(TCGArg)(var + (long)tcg_ctx),
                      (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                      (ulong)(uVar2 & 4) + ((ulong)(uVar2 & 8) | (ulong)(uVar1 >> 2) << 8) + 0xc10);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var + (long)tcg_ctx));
  return;
}

Assistant:

static void neon_store_reg(TCGContext *tcg_ctx, int reg, int pass, TCGv_i32 var)
{
    tcg_gen_st_i32(tcg_ctx, var, tcg_ctx->cpu_env, neon_reg_offset(reg, pass));
    tcg_temp_free_i32(tcg_ctx, var);
}